

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_upvaluejoin(lua_State *L,int fidx1,int n1,int fidx2,int n2)

{
  GCObject *o;
  GCObject *v;
  TValue *pTVar1;
  GCObject **ppGVar2;
  lua_CFunction p_Var3;
  
  pTVar1 = index2value(L,fidx1);
  o = (pTVar1->value_).gc;
  p_Var3 = (lua_CFunction)&getupvalref_nullup;
  ppGVar2 = (GCObject **)&getupvalref_nullup;
  if ((0 < n1) &&
     (ppGVar2 = (GCObject **)&getupvalref_nullup, n1 <= *(int *)(*(long *)&o[1].tt + 0x10))) {
    ppGVar2 = &o[2].next + (n1 - 1);
  }
  pTVar1 = index2value(L,fidx2);
  if ((0 < n2) && (n2 <= *(int *)(*(long *)((pTVar1->value_).f + 0x18) + 0x10))) {
    p_Var3 = (pTVar1->value_).f + (ulong)(n2 - 1) * 8 + 0x20;
  }
  v = *(GCObject **)p_Var3;
  *ppGVar2 = v;
  if (((o->marked & 0x20) != 0) && ((v->marked & 0x18) != 0)) {
    luaC_barrier_(L,o,v);
    return;
  }
  return;
}

Assistant:

LUA_API void lua_upvaluejoin (lua_State *L, int fidx1, int n1,
                                            int fidx2, int n2) {
  LClosure *f1;
  UpVal **up1 = getupvalref(L, fidx1, n1, &f1);
  UpVal **up2 = getupvalref(L, fidx2, n2, NULL);
  api_check(L, *up1 != NULL && *up2 != NULL, "invalid upvalue index");
  *up1 = *up2;
  luaC_objbarrier(L, f1, *up1);
}